

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

int64_t __thiscall embree::TutorialApplication::getNumRays(TutorialApplication *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar2 = 0;
  iVar1 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  if (iVar1 != 0) {
    lVar3 = 0;
    uVar4 = 0;
    lVar2 = 0;
    do {
      lVar2 = lVar2 + *(int *)((long)g_stats->pad + lVar3 + -4);
      uVar4 = uVar4 + 1;
      iVar1 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      lVar3 = lVar3 + 0x80;
    } while (uVar4 < (ulong)(long)iVar1);
  }
  return lVar2;
}

Assistant:

int64_t TutorialApplication::getNumRays()
  {
    int64_t numRays = 0;
    for (size_t i = 0; i < TaskScheduler::threadCount(); i++)
      numRays += g_stats[i].numRays;
    return numRays;
  }